

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O1

int mdb_midl_append_range(MDB_IDL *idp,MDB_ID id,uint n)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar3 = *idp;
  uVar1 = *puVar3;
  uVar4 = (ulong)n;
  uVar5 = uVar1 + uVar4;
  if (puVar3[-1] < uVar5) {
    iVar2 = mdb_midl_grow(idp,n | 0x1ffff);
    if (iVar2 != 0) {
      return 0xc;
    }
    puVar3 = *idp;
  }
  *puVar3 = uVar5;
  if (n != 0) {
    do {
      uVar5 = uVar4 - 1;
      puVar3[uVar1 + uVar4] = id;
      id = id + 1;
      uVar4 = uVar5;
    } while ((int)uVar5 != 0);
  }
  return 0;
}

Assistant:

int mdb_midl_append_range( MDB_IDL *idp, MDB_ID id, unsigned n )
{
	MDB_ID *ids = *idp, len = ids[0];
	/* Too big? */
	if (len + n > ids[-1]) {
		if (mdb_midl_grow(idp, n | MDB_IDL_UM_MAX))
			return ENOMEM;
		ids = *idp;
	}
	ids[0] = len + n;
	ids += len;
	while (n)
		ids[n--] = id++;
	return 0;
}